

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int64_t hdr_value_at_percentile(hdr_histogram *h,double percentile)

{
  long lVar1;
  ulong uVar2;
  ulong value;
  int64_t iVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  dVar6 = percentile;
  if (100.0 <= percentile) {
    dVar6 = 100.0;
  }
  lVar1 = (long)((double)h->total_count * (dVar6 / 100.0) + 0.5);
  lVar4 = 1;
  if (1 < lVar1) {
    lVar4 = lVar1;
  }
  value = 0;
  uVar5 = (ulong)(uint)h->counts_len;
  if (h->counts_len < 1) {
    uVar5 = value;
  }
  uVar2 = 0;
  lVar1 = 0;
  do {
    if (uVar5 == uVar2) {
LAB_00102d5c:
      if ((percentile == 0.0) && (!NAN(percentile))) {
        iVar3 = lowest_equivalent_value(h,value);
        return iVar3;
      }
      iVar3 = highest_equivalent_value(h,value);
      return iVar3;
    }
    lVar1 = lVar1 + h->counts[uVar2];
    if (lVar4 <= lVar1) {
      value = hdr_value_at_index(h,(int32_t)uVar2);
      goto LAB_00102d5c;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

int64_t hdr_value_at_percentile(const struct hdr_histogram* h, double percentile)
{
    double requested_percentile = percentile < 100.0 ? percentile : 100.0;
    int64_t count_at_percentile =
        (int64_t) (((requested_percentile / 100) * h->total_count) + 0.5);
    int64_t value_from_idx = get_value_from_idx_up_to_count(h, count_at_percentile);
    if (percentile == 0.0)
    {
        return lowest_equivalent_value(h, value_from_idx);
    }
    return highest_equivalent_value(h, value_from_idx);
}